

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

_Bool run_container_validate(run_container_t *run,char **reason)

{
  ushort uVar1;
  uint uVar2;
  rle16_t *prVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = run->n_runs;
  if ((long)(int)uVar2 < 0) {
    pcVar4 = "negative run count";
  }
  else if (run->capacity < 0) {
    pcVar4 = "negative run capacity";
  }
  else if ((uint)run->capacity < uVar2) {
    pcVar4 = "capacity less than run count";
  }
  else if (uVar2 == 0) {
    pcVar4 = "zero run count";
  }
  else {
    prVar3 = run->runs;
    if (prVar3 == (rle16_t *)0x0) {
      pcVar4 = "NULL runs";
    }
    else {
      lVar7 = 0;
      pcVar4 = "run start + length too large";
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if ((int)uVar2 == lVar7) {
          return true;
        }
        uVar1 = prVar3[lVar7].value;
        if (0xffff < (uint)prVar3[lVar7].length + (uint)uVar1) goto LAB_00119ac8;
        if (uVar1 < uVar5) {
          pcVar4 = "run start less than last end";
          goto LAB_00119ac8;
        }
        uVar6 = (uint)prVar3[lVar7].length + (uint)uVar1 + 1;
        lVar7 = lVar7 + 1;
      } while ((uVar5 == 0) || (uVar5 != uVar1));
      pcVar4 = "run start equal to last end, should have combined";
    }
  }
LAB_00119ac8:
  *reason = pcVar4;
  return false;
}

Assistant:

bool run_container_validate(const run_container_t *run, const char **reason) {
    if (run->n_runs < 0) {
        *reason = "negative run count";
        return false;
    }
    if (run->capacity < 0) {
        *reason = "negative run capacity";
        return false;
    }
    if (run->capacity < run->n_runs) {
        *reason = "capacity less than run count";
        return false;
    }

    if (run->n_runs == 0) {
        *reason = "zero run count";
        return false;
    }
    if (run->runs == NULL) {
        *reason = "NULL runs";
        return false;
    }

    // Use uint32_t to avoid overflow issues on ranges that contain UINT16_MAX.
    uint32_t last_end = 0;
    for (int i = 0; i < run->n_runs; ++i) {
        uint32_t start = run->runs[i].value;
        uint32_t end = start + run->runs[i].length + 1;
        if (end <= start) {
            *reason = "run start + length overflow";
            return false;
        }
        if (end > (1 << 16)) {
            *reason = "run start + length too large";
            return false;
        }
        if (start < last_end) {
            *reason = "run start less than last end";
            return false;
        }
        if (start == last_end && last_end != 0) {
            *reason = "run start equal to last end, should have combined";
            return false;
        }
        last_end = end;
    }
    return true;
}